

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<pbrt::Normal3<float>,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),pbrt::Normal3<float>(*)(double_const*,pbrt::FileLoc_const*)>
          (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
           *__return_storage_ptr__,ParameterDictionary *this,string *name,ParameterType type,
          char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_Normal3<float>_double_ptr_FileLoc_ptr *convert)

{
  string *args;
  undefined8 uVar1;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  size_t sVar3;
  ParsedParameter *pPVar4;
  size_t __n;
  ulong uVar5;
  pointer pNVar6;
  int iVar7;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined4 in_XMM1_Da;
  allocator_type local_49;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *local_48;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *local_40;
  int local_38;
  int local_34;
  undefined1 extraout_var [56];
  
  paVar2 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar3 = (this->params).nStored;
  paVar8 = &(this->params).field_2;
  if (paVar2 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar8 = paVar2;
  }
  local_48 = __return_storage_ptr__;
  if (sVar3 != 0) {
    lVar11 = 0;
    local_40 = (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)typeName;
    local_38 = nPerItem;
    do {
      pPVar4 = *(ParsedParameter **)((long)paVar8 + lVar11);
      __n = (pPVar4->name)._M_string_length;
      if ((__n == name->_M_string_length) &&
         (((args = &pPVar4->name, __n == 0 ||
           (iVar7 = bcmp((args->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar7 == 0)) &&
          (iVar7 = std::__cxx11::string::compare((char *)pPVar4), iVar7 == 0)))) {
        local_40 = (*getValues)(pPVar4);
        local_34 = local_38;
        uVar5 = local_40->nStored;
        if (uVar5 == 0) {
          ErrorExit<std::__cxx11::string_const&>(&pPVar4->loc,"No values provided for \"%s\".",args)
          ;
        }
        uVar9 = (ulong)local_38;
        if (uVar5 % uVar9 == 0) {
          pPVar4->lookedUp = true;
          std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::vector
                    (local_48,uVar5 / uVar9,&local_49);
          if (uVar5 < uVar9) {
            return local_48;
          }
          lVar11 = 8;
          lVar10 = 0;
          uVar12 = 0;
          do {
            auVar13._0_8_ = (*convert)((double *)((long)local_40->ptr + lVar10),&pPVar4->loc);
            auVar13._8_56_ = extraout_var;
            uVar12 = uVar12 + 1;
            lVar10 = lVar10 + uVar9 * 8;
            pNVar6 = (local_48->
                     super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar1 = vmovlps_avx(auVar13._0_16_);
            *(undefined8 *)((long)pNVar6 + lVar11 + -8) = uVar1;
            *(undefined4 *)((long)&(pNVar6->super_Tuple3<pbrt::Normal3,_float>).x + lVar11) =
                 in_XMM1_Da;
            lVar11 = lVar11 + 0xc;
          } while (uVar12 < uVar5 / uVar9);
          return local_48;
        }
        ErrorExit<std::__cxx11::string_const&,int&>
                  (&pPVar4->loc,"Number of values provided for \"%s\" not a multiple of %d",args,
                   &local_34);
      }
      lVar11 = lVar11 + 8;
    } while (sVar3 << 3 != lVar11);
  }
  (local_48->super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_48->super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_48->super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_48;
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}